

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usage_config.cc
# Opt level: O0

string * __thiscall
absl::lts_20240722::flags_internal::(anonymous_namespace)::NormalizeFilename_abi_cxx11_
          (string *__return_storage_ptr__,void *this,string_view filename)

{
  allocator<char> local_3d [20];
  allocator<char> local_29;
  size_type local_28;
  size_type pos;
  string_view filename_local;
  
  filename_local._M_len = filename._M_len;
  pos = (size_type)this;
  filename_local._M_str = (char *)__return_storage_ptr__;
  local_28 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_not_of
                       ((basic_string_view<char,_std::char_traits<char>_> *)&pos,"\\/",0);
  if (local_28 == 0xffffffffffffffff) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_29);
    std::allocator<char>::~allocator(&local_29);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
              ((basic_string_view<char,_std::char_traits<char>_> *)&pos,local_28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)__return_storage_ptr__,
               (basic_string_view<char,_std::char_traits<char>_> *)&pos,local_3d);
    std::allocator<char>::~allocator(local_3d);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string NormalizeFilename(absl::string_view filename) {
  // Skip any leading slashes
  auto pos = filename.find_first_not_of("\\/");
  if (pos == absl::string_view::npos) return "";

  filename.remove_prefix(pos);
  return std::string(filename);
}